

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::setHandleOption
          (CommonCore *this,InterfaceHandle handle,int32_t option,int32_t option_value)

{
  shared_mutex *__rwlock;
  char cVar1;
  int iVar2;
  pair<helics::route_id,_helics::ActionMessage> *ppVar3;
  FederateState *this_00;
  ActionMessage fcn;
  ActionMessage AStack_e8;
  
  ppVar3 = getHandleInfo(this,handle);
  if (ppVar3 != (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    __rwlock = &(this->handles).m_mutex;
    iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
    if (iVar2 == 0x23) {
      std::__throw_system_error(0x23);
    }
    HandleManager::setHandleOption(&(this->handles).m_obj,handle,option,option_value);
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    ActionMessage::ActionMessage(&AStack_e8,cmd_interface_configure);
    cVar1 = (char)(ppVar3->second).messageID;
    AStack_e8.counter = (uint16_t)cVar1;
    if (option_value != 0) {
      AStack_e8.flags._0_1_ = (byte)AStack_e8.flags | 0x20;
    }
    AStack_e8.messageID = option;
    AStack_e8.source_handle.hid = option_value;
    AStack_e8.dest_handle.hid = handle.hid;
    if (cVar1 != 'f') {
      this_00 = getHandleFederate(this,handle);
      if (this_00 != (FederateState *)0x0) {
        AStack_e8.dest_id.gid = (this_00->global_id)._M_i.gid;
        FederateState::setProperties(this_00,&AStack_e8);
      }
    }
    ActionMessage::~ActionMessage(&AStack_e8);
  }
  return;
}

Assistant:

void CommonCore::setHandleOption(InterfaceHandle handle, int32_t option, int32_t option_value)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        return;
    }
    handles.modify([handle, option, option_value](auto& hand) {
        return hand.setHandleOption(handle, option, option_value);
    });

    ActionMessage fcn(CMD_INTERFACE_CONFIGURE);
    fcn.dest_handle = handle;
    fcn.messageID = option;
    fcn.counter = static_cast<uint16_t>(handleInfo->handleType);
    fcn.setExtraDestData(option_value);
    if (option_value != 0) {
        setActionFlag(fcn, indicator_flag);
    }
    if (handleInfo->handleType != InterfaceType::FILTER) {
        auto* fed = getHandleFederate(handle);
        if (fed != nullptr) {
            fcn.dest_id = fed->global_id;
            fed->setProperties(fcn);
        }
    } else {
        // must be for filter
    }
}